

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputGetString
               (HelicsInput inp,char *outputString,int maxStringLen,int *actualLength,
               HelicsError *err)

{
  int iVar1;
  HelicsInput pvVar2;
  
  if (actualLength != (int *)0x0) {
    *actualLength = 0;
  }
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8f88;
    }
    else {
      pvVar2 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar2 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a8f8a;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a8f88:
  pvVar2 = (HelicsInput)0x0;
LAB_001a8f8a:
  if (pvVar2 != (HelicsInput)0x0) {
    if (err != (HelicsError *)0x0 && (0 >= maxStringLen || outputString == (char *)0x0)) {
      err->error_code = -4;
      err->message = "Output string location is invalid";
    }
    if ((0 < maxStringLen && outputString != (char *)0x0) &&
       (iVar1 = helics::Input::getValue(*(Input **)((long)pvVar2 + 0x18),outputString,maxStringLen),
       actualLength != (int *)0x0)) {
      *actualLength = iVar1;
    }
  }
  return;
}

Assistant:

void helicsInputGetString(HelicsInput inp, char* outputString, int maxStringLen, int* actualLength, HelicsError* err)
{
    if (actualLength != nullptr) {  // for initialization
        *actualLength = 0;
    }
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    if (!checkOutputArgString(outputString, maxStringLen, err)) {
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(outputString, maxStringLen);
        if (actualLength != nullptr) {  // for initialization
            *actualLength = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}